

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet.cpp
# Opt level: O1

PacketBuilder * __thiscall PacketBuilder::AddString(PacketBuilder *this,string *str)

{
  std::__cxx11::string::_M_append((char *)&this->data,(ulong)(str->_M_dataplus)._M_p);
  return this;
}

Assistant:

PacketBuilder &PacketBuilder::AddString(const std::string &str)
{
#ifdef DEBUG
	std::size_t capacity_before = this->Capacity();
#endif

	this->data += str;

#ifdef DEBUG
	if (this->data.length() > capacity_before)
		debug_packetbuilder_overflow(this, capacity_before);
#endif

	return *this;
}